

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

lws_fop_flags_t lws_vfs_prepare_flags(lws *wsi)

{
  int iVar1;
  char *pcVar2;
  lws_fop_flags_t lVar3;
  
  iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_ACCEPT_ENCODING);
  lVar3 = 0;
  if (iVar1 != 0) {
    pcVar2 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_ACCEPT_ENCODING);
    pcVar2 = strstr(pcVar2,"gzip");
    lVar3 = 0;
    if (pcVar2 != (char *)0x0) {
      _lws_log(8,"client indicates GZIP is acceptable\n");
      lVar3 = 0x1000000;
    }
  }
  return lVar3;
}

Assistant:

static lws_fop_flags_t
lws_vfs_prepare_flags(struct lws *wsi)
{
	lws_fop_flags_t f = 0;

	if (!lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_ACCEPT_ENCODING))
		return f;

	if (strstr(lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_ACCEPT_ENCODING),
		   "gzip")) {
		lwsl_info("client indicates GZIP is acceptable\n");
		f |= LWS_FOP_FLAG_COMPR_ACCEPTABLE_GZIP;
	}

	return f;
}